

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *softmaxInputName,
               char *targetName)

{
  int iVar1;
  string *psVar2;
  NetworkUpdateParameters *this;
  Type *this_00;
  CategoricalCrossEntropyLossLayer *pCVar3;
  ModelDescription *this_01;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(nn->updateparams_->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::LossLayer::set_name(this_00,lossName);
  if (this_00->_oneof_case_[0] != 10) {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 10;
    pCVar3 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (pCVar3);
    (this_00->LossLayerType_).categoricalcrossentropylosslayer_ = pCVar3;
  }
  pCVar3 = (this_00->LossLayerType_).categoricalcrossentropylosslayer_;
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(pCVar3,softmaxInputName);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(pCVar3,targetName);
  if (m->description_ == (ModelDescription *)0x0) {
    this_01 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(this_01);
    m->description_ = this_01;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(m->description_->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar2 = (pTVar4->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar4->name_,(pCVar3->target_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if (pTVar4->type_ == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  pAVar6 = (pFVar5->Type_).multiarraytype_;
  pAVar6->datatype_ = 0x20020;
  iVar1 = (pAVar6->shape_).total_size_;
  if ((pAVar6->shape_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar6->shape_,iVar1 + 1);
  }
  iVar1 = (pAVar6->shape_).current_size_;
  (pAVar6->shape_).current_size_ = iVar1 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar1] = 1;
  return;
}

Assistant:

void addCategoricalCrossEntropyLoss(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *softmaxInputName, const char *targetName) {

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxInputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

}